

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall capnp::LocalClient::~LocalClient(LocalClient *this)

{
  Server *pSVar1;
  ClientHook *pCVar2;
  Disposer *pDVar3;
  ForkHub<kj::_::Void> *pFVar4;
  
  pSVar1 = (this->server).ptr.ptr;
  if (pSVar1 != (Server *)0x0) {
    (pSVar1->thisHook).ptr = (ClientHook *)0x0;
  }
  if ((this->brokenException).ptr.isSet == true) {
    kj::Exception::~Exception(&(this->brokenException).ptr.field_1.value);
  }
  if ((this->revoker).ptr.isSet == true) {
    kj::Canceler::~Canceler(&(this->revoker).ptr.field_1.value);
  }
  pCVar2 = (this->resolved).ptr.ptr;
  if (pCVar2 != (ClientHook *)0x0) {
    (this->resolved).ptr.ptr = (ClientHook *)0x0;
    pDVar3 = (this->resolved).ptr.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(_func_int *)
                      ((long)&pCVar2->_vptr_ClientHook + (long)pCVar2->_vptr_ClientHook[-2]));
  }
  if (((this->resolveTask).ptr.isSet == true) &&
     (pFVar4 = (this->resolveTask).ptr.field_1.value.hub.ptr, pFVar4 != (ForkHub<kj::_::Void> *)0x0)
     ) {
    (this->resolveTask).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    pDVar3 = (this->resolveTask).ptr.field_1.value.hub.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(_func_int *)
                      ((long)&(pFVar4->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar4->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  pSVar1 = (this->server).ptr.ptr;
  if (pSVar1 != (Server *)0x0) {
    (this->server).ptr.ptr = (Server *)0x0;
    pDVar3 = (this->server).ptr.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~LocalClient() noexcept(false) {
    KJ_IF_SOME(s, server) {
      s->thisHook = kj::none;
    }
  }